

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void mouse_button_callback(GLFWwindow *window,int button,int action,int mods)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  double dVar7;
  Slot *slot;
  int mods_local;
  int action_local;
  int button_local;
  GLFWwindow *window_local;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  dVar7 = glfwGetTime();
  pcVar4 = get_button_name(button);
  pcVar5 = get_mods_name(mods);
  pcVar6 = get_action_name(action);
  printf("%08x to %i at %0.3f: Mouse button %i (%s) (with%s) was %s\n",dVar7,(ulong)uVar2,
         (ulong)uVar1,(ulong)(uint)button,pcVar4,pcVar5,pcVar6);
  return;
}

Assistant:

static void mouse_button_callback(GLFWwindow* window, int button, int action, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Mouse button %i (%s) (with%s) was %s\n",
           counter++, slot->number, glfwGetTime(), button,
           get_button_name(button),
           get_mods_name(mods),
           get_action_name(action));
}